

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger class_newmember(HSQUIRRELVM v)

{
  int iVar1;
  SQRESULT SVar2;
  SQBool local_20;
  SQBool bstatic;
  SQInteger top;
  HSQUIRRELVM v_local;
  
  top = (SQInteger)v;
  bstatic = sq_gettop(v);
  local_20 = 0;
  if (bstatic == 5) {
    sq_tobool((HSQUIRRELVM)top,-1,&local_20);
    sq_pop((HSQUIRRELVM)top,1);
  }
  if ((long)bstatic < 4) {
    sq_pushnull((HSQUIRRELVM)top);
  }
  SVar2 = sq_newmember((HSQUIRRELVM)top,-4,local_20);
  iVar1 = -1;
  if (-1 < SVar2) {
    iVar1 = 1;
  }
  return (long)iVar1;
}

Assistant:

static SQInteger class_newmember(HSQUIRRELVM v)
{
    SQInteger top = sq_gettop(v);
    SQBool bstatic = SQFalse;
    if(top == 5)
    {
        sq_tobool(v,-1,&bstatic);
        sq_pop(v,1);
    }

    if(top < 4) {
        sq_pushnull(v);
    }
    return SQ_SUCCEEDED(sq_newmember(v,-4,bstatic))?1:SQ_ERROR;
}